

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O2

void __thiscall
bgui::FileImageWindow::load(FileImageWindow *this,uint *pos,bool down,int w,int h,bool size_max)

{
  pointer pbVar1;
  double dVar2;
  keep kVar3;
  int iVar4;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this_00;
  ImageIO *pIVar5;
  ImageAdapter<unsigned_char> *this_01;
  keep k;
  undefined1 size_max_00;
  int flip;
  int rotation;
  Properties prop;
  
  this_01 = (ImageAdapter<unsigned_char> *)0x0;
  while ((this_01 == (ImageAdapter<unsigned_char> *)0x0 &&
         ((ulong)*pos <
          (ulong)((long)(this->list).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->list).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5)))) {
    this_00 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)operator_new(0x38);
    gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image(this_00,0,0,1);
    pIVar5 = gimage::getImageIO();
    gimage::ImageIO::load
              (pIVar5,this_00,
               (this->list).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*pos]._M_dataplus._M_p,1,0,0,-1,-1);
    this_01 = (ImageAdapter<unsigned_char> *)operator_new(0xa8);
    ImageAdapter<unsigned_char>::ImageAdapter(this_01,this_00,this->vmin,this->vmax,true);
  }
  if (this->watch_file == true) {
    BaseWindow::removeFileWatch((BaseWindow *)this,this->wid);
    pbVar1 = (this->list).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)*pos <
        (ulong)((long)(this->list).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
      iVar4 = BaseWindow::addFileWatch((BaseWindow *)this,pbVar1[*pos]._M_dataplus._M_p);
      this->wid = iVar4;
    }
    else {
      this->watch_file = false;
    }
  }
  if (this_01 == (ImageAdapter<unsigned_char> *)0x0) {
    ImageWindow::setAdapter
              (&this->super_ImageWindow,(ImageAdapterBase *)0x0,false,keep_none,-1,-1,false);
    goto LAB_001205ff;
  }
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &prop.data._M_t._M_impl.super__Rb_tree_header._M_header;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pIVar5 = gimage::getImageIO();
  gimage::ImageIO::loadProperties
            (pIVar5,&prop,
             (this->list).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*pos]._M_dataplus._M_p);
  gutil::Properties::getValue<int>(&prop,"rotation",&rotation,"0");
  gutil::Properties::getValue<int>(&prop,"flip",&flip,"0");
  ImageAdapterBase::setRotationFlip(&this_01->super_ImageAdapterBase,rotation / 0x5a,flip != 0);
  (this_01->super_ImageAdapterBase).scale = this->scale;
  dVar2 = this->imax;
  k = this->kp;
  if (k == keep_all && this->imin < dVar2) {
    (this_01->super_ImageAdapterBase).imin = this->imin;
    (this_01->super_ImageAdapterBase).imax = dVar2;
  }
  kVar3 = keep_none;
  if (w < 1 || h < 1) {
    size_max_00 = false;
    h = -1;
    kVar3 = k;
    w = h;
    size_max = (bool)0;
    if (k == keep_none) goto LAB_001205a8;
  }
  else {
LAB_001205a8:
    size_max_00 = size_max;
    k = kVar3;
    (this_01->super_ImageAdapterBase).map = this->map;
    (this_01->super_ImageAdapterBase).channel = this->channel;
  }
  ImageWindow::setAdapter
            (&this->super_ImageWindow,&this_01->super_ImageAdapterBase,true,k,w,h,(bool)size_max_00)
  ;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&prop);
LAB_001205ff:
  updateTitle(this);
  return;
}

Assistant:

void FileImageWindow::load(unsigned int &pos, bool down, int w, int h, bool size_max)
{
  ImageAdapterBase *adapt=0;

  // load image and store in adatper

  while (adapt == 0 && pos < list.size())
  {
    gimage::ImageU8    *imageu8=0;

    try
    {
      imageu8=new gimage::ImageU8();
      gimage::getImageIO().load(*imageu8, list[pos].c_str());
      adapt=new ImageAdapter<unsigned char>(imageu8, vmin, vmax, true);
      imageu8=0;
    }
    catch (const gutil::Exception &)
    {
      gimage::ImageU16   *imageu16=0;

      delete imageu8;
      imageu8=0;

      try
      {
        imageu16=new gimage::ImageU16();
        gimage::getImageIO().load(*imageu16, list[pos].c_str());
        adapt=new ImageAdapter<unsigned short>(imageu16, vmin, vmax, true);
        imageu16=0;
      }
      catch (const gutil::Exception &)
      {
        gimage::ImageFloat *imagefloat=0;

        delete imageu16;
        imageu16=0;

        try
        {
          imagefloat=new gimage::ImageFloat();
          gimage::getImageIO().load(*imagefloat, list[pos].c_str());
          adapt=new ImageAdapter<float>(imagefloat, vmin, vmax, true);
          imagefloat=0;
        }
        catch (const gutil::Exception &)
        {
          delete imagefloat;
          imagefloat=0;

          std::cerr << "Cannot load image: " << list[pos] << std::endl;

          if (down)
          {
            list.erase(list.begin()+pos);

            if (pos > 0 && pos >= list.size())
            {
              pos--;
            }
          }
          else
          {
            list.erase(list.begin()+pos);

            if (pos > 0)
            {
              pos--;
            }
          }
        }
      }
    }
  }

  // watch file

  if (watch_file)
  {
    removeFileWatch(wid);

    if (pos < list.size())
    {
      wid=addFileWatch(list[pos].c_str());
    }
    else
    {
      watch_file=false;
    }
  }

  // set image adapter and title

  if (adapt != 0)
  {
    gutil::Properties prop;
    gimage::getImageIO().loadProperties(prop, list[pos].c_str());

    int rotation, flip;
    prop.getValue("rotation", rotation, "0");
    prop.getValue("flip", flip, "0");

    adapt->setRotationFlip(rotation/90, flip != 0);

    adapt->setScale(scale);

    if (imin < imax && kp == keep_all)
    {
      adapt->setMinIntensity(imin);
      adapt->setMaxIntensity(imax);
    }

    if (w > 0 && h > 0)
    {
      adapt->setMapping(map);
      adapt->setChannel(channel);
      setAdapter(adapt, true, keep_none, w, h, size_max);
    }
    else
    {
      if (kp == keep_none)
      {
        adapt->setMapping(map);
        adapt->setChannel(channel);
      }

      setAdapter(adapt, true, kp);
    }
  }
  else
  {
    setAdapter(0);
  }

  updateTitle();
}